

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

void modify_location(CHAR_DATA *ch,int location,int mod,bool add)

{
  short *psVar1;
  PC_DATA *pPVar2;
  bool bVar3;
  long lVar4;
  undefined7 in_register_00000009;
  short sVar5;
  int iVar6;
  float fVar7;
  
  iVar6 = -mod;
  if ((int)CONCAT71(in_register_00000009,add) != 0) {
    iVar6 = mod;
  }
  sVar5 = (short)iVar6;
  switch(location) {
  case 1:
    ch->mod_stat[0] = ch->mod_stat[0] + sVar5;
    break;
  case 2:
    ch->mod_stat[3] = ch->mod_stat[3] + sVar5;
    break;
  case 3:
    ch->mod_stat[1] = ch->mod_stat[1] + sVar5;
    break;
  case 4:
    ch->mod_stat[2] = ch->mod_stat[2] + sVar5;
    break;
  case 5:
    ch->mod_stat[4] = ch->mod_stat[4] + sVar5;
    break;
  case 6:
    ch->sex = ch->sex + sVar5;
    break;
  case 0xc:
    ch->max_mana = ch->max_mana + sVar5;
    break;
  case 0xd:
    ch->max_hit = ch->max_hit + sVar5;
    break;
  case 0xe:
    ch->max_move = ch->max_move + sVar5;
    break;
  case 0x11:
    lVar4 = 0;
    do {
      ch->armor[lVar4] = ch->armor[lVar4] + sVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    break;
  case 0x12:
    ch->hitroll = ch->hitroll + sVar5;
    break;
  case 0x13:
    ch->damroll = ch->damroll + sVar5;
    break;
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
    ch->saving_throw = ch->saving_throw + sVar5;
    break;
  case 0x1b:
    ch->carry_weight = ch->carry_weight + sVar5;
    break;
  case 0x1c:
    ch->defense_mod = ch->defense_mod + sVar5;
    break;
  case 0x1d:
    ch->regen_rate = ch->regen_rate + sVar5;
    break;
  case 0x1e:
    ch->size = ch->size + sVar5;
    break;
  case 0x1f:
    bVar3 = is_npc(ch);
    if (!bVar3) {
      psVar1 = &ch->pcdata->energy_state;
      *psVar1 = *psVar1 + sVar5;
    }
    break;
  case 0x20:
    fVar7 = (float)mod / 100.0 + 1.0;
    if (add) {
      ch->dam_mod = fVar7 * ch->dam_mod;
    }
    else {
      ch->dam_mod = (1.0 / fVar7) * ch->dam_mod;
    }
    break;
  case 0x21:
    ch->legs = ch->legs + sVar5;
    break;
  case 0x22:
    ch->arms = ch->arms + sVar5;
    break;
  case 0x23:
    pPVar2 = ch->pcdata;
    iVar6 = iVar6 + pPVar2->beauty;
    if (iVar6 < 0xb) {
      pPVar2->beauty = (short)iVar6;
    }
    else {
      pPVar2->beauty = 10;
    }
    break;
  case 0x24:
    ch->alignment = ch->alignment + sVar5;
    break;
  case 0x25:
    bVar3 = is_npc(ch);
    if (!bVar3) {
      psVar1 = &ch->pcdata->ethos;
      *psVar1 = *psVar1 + sVar5;
    }
  }
  return;
}

Assistant:

void modify_location(CHAR_DATA *ch, int location, int mod, bool add)
{
	int i;
	if (!add)
		mod = 0 - mod;

	switch (location)
	{
		case APPLY_NONE:
			break;
		case APPLY_STR:
			ch->mod_stat[STAT_STR] += mod;
			break;
		case APPLY_DEX:
			ch->mod_stat[STAT_DEX] += mod;
			break;
		case APPLY_INT:
			ch->mod_stat[STAT_INT] += mod;
			break;
		case APPLY_WIS:
			ch->mod_stat[STAT_WIS] += mod;
			break;
		case APPLY_CON:
			ch->mod_stat[STAT_CON] += mod;
			break;
		case APPLY_SEX:
			ch->sex += mod;
			break;
		case APPLY_CLASS:
			break;
		case APPLY_AGE:
			break;
		case APPLY_HEIGHT:
			break;
		case APPLY_WEIGHT:
			break;
		case APPLY_MANA:
			ch->max_mana += mod;
			break;
		case APPLY_HIT:
			ch->max_hit += mod;
			break;
		case APPLY_MOVE:
			ch->max_move += mod;
			break;
		case APPLY_GOLD:
			break;
		case APPLY_EXP:
			break;
		case APPLY_AC:
			for (i = 0; i < 4; i++)
				ch->armor[i] += mod;
			break;
		case APPLY_HITROLL:
			ch->hitroll += mod;
			break;
		case APPLY_DAMROLL:
			ch->damroll += mod;
			break;
		case APPLY_SAVES:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_PARA:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_ROD:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_PETRI:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_BREATH:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_SPELL:
			ch->saving_throw += mod;
			break;
		case APPLY_SPELL_AFFECT:
			break;
		case APPLY_CARRY_WEIGHT:
			ch->carry_weight += mod;
			break;
		case APPLY_DEFENSE:
			ch->defense_mod += mod;
			break;
		case APPLY_SIZE:
			ch->size += mod;
			break;
		case APPLY_REGENERATION:
			ch->regen_rate += mod;
			break;
		case APPLY_ENERGYSTATE:
			if (!is_npc(ch))
				ch->pcdata->energy_state += mod;
			break;
		case APPLY_ARMS:
			ch->arms += mod;
			break;
		case APPLY_LEGS:
			ch->legs += mod;
			break;
		case APPLY_ALIGNMENT:
			ch->alignment += mod;
			break;
		case APPLY_ETHOS:
			if (!is_npc(ch))
				ch->pcdata->ethos += mod;
			break;
		case APPLY_BEAUTY:
			if (ch->pcdata->beauty + mod > MAX_BEAUTY)
				ch->pcdata->beauty = MAX_BEAUTY;
			else
				ch->pcdata->beauty += mod;
			break;
		case APPLY_DAM_MOD:
			if (add)
				ch->dam_mod *= (1.00f + (float)mod / 100.00f);
			else
			{
				mod = 0 - mod;
				ch->dam_mod *= 1.00f / (1.00f + (float)mod / 100.00f);
			}
			break;
	}
}